

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

Marray<float,_std::allocator<unsigned_long>_> * __thiscall
andres::Marray<float,std::allocator<unsigned_long>>::operator=
          (Marray<float,std::allocator<unsigned_long>> *this,
          ViewExpression<andres::BinaryViewExpression<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::Minus<float,_float,_float>_>,_float>
          *expression)

{
  CoordinateOrder CVar1;
  View<float,_true,_std::allocator<unsigned_long>_> *this_00;
  long lVar2;
  bool bVar3;
  float *pfVar4;
  size_t sVar5;
  ulong uVar6;
  runtime_error *this_01;
  long lVar7;
  undefined8 *puVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  Marray<float,_std::allocator<unsigned_long>_> m;
  allocator_type local_61;
  Marray<float,_std::allocator<unsigned_long>_> local_60;
  
  bVar3 = BinaryViewExpression<andres::View<float,true,std::allocator<unsigned_long>>,float,andres::View<float,true,std::allocator<unsigned_long>>,float,andres::marray_detail::Minus<float,float,float>>
          ::overlaps<float,false,std::allocator<unsigned_long>>
                    ((BinaryViewExpression<andres::View<float,true,std::allocator<unsigned_long>>,float,andres::View<float,true,std::allocator<unsigned_long>>,float,andres::marray_detail::Minus<float,float,float>>
                      *)expression,(View<float,_false,_std::allocator<unsigned_long>_> *)this);
  if (bVar3) {
    Marray<andres::BinaryViewExpression<andres::View<float,true,std::allocator<unsigned_long>>,float,andres::View<float,true,std::allocator<unsigned_long>>,float,andres::marray_detail::Minus<float,float,float>>,float>
              ((Marray<float,std::allocator<unsigned_long>> *)&local_60,expression,&local_61);
    Marray<float,_std::allocator<unsigned_long>_>::operator=
              ((Marray<float,_std::allocator<unsigned_long>_> *)this,&local_60);
    operator_delete(local_60.super_View<float,_false,_std::allocator<unsigned_long>_>.data_,
                    local_60.super_View<float,_false,_std::allocator<unsigned_long>_>.geometry_.
                    size_ << 2);
    operator_delete(local_60.super_View<float,_false,_std::allocator<unsigned_long>_>.geometry_.
                    shape_,local_60.super_View<float,_false,_std::allocator<unsigned_long>_>.
                           geometry_.dimension_ * 0x18);
    return (Marray<float,_std::allocator<unsigned_long>_> *)this;
  }
  uVar11 = *(ulong *)(*(long *)(expression + 8) + 0x30);
  if (*(ulong *)(*(long *)(expression + 8) + 0x30) < *(ulong *)(*(long *)expression + 0x30)) {
    uVar11 = *(ulong *)(*(long *)expression + 0x30);
  }
  if (*(ulong *)(this + 0x30) != uVar11) {
    operator_delete(*(void **)this,*(ulong *)(this + 0x30) << 2);
    uVar11 = *(ulong *)(*(long *)(expression + 8) + 0x30);
    if (*(ulong *)(*(long *)(expression + 8) + 0x30) < *(ulong *)(*(long *)expression + 0x30)) {
      uVar11 = *(ulong *)(*(long *)expression + 0x30);
    }
    pfVar4 = __gnu_cxx::new_allocator<float>::allocate
                       ((new_allocator<float> *)(this + 0x40),uVar11,(void *)0x0);
    *(float **)this = pfVar4;
  }
  sVar5 = BinaryViewExpression<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::Minus<float,_float,_float>_>
          ::dimension((BinaryViewExpression<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::Minus<float,_float,_float>_>
                       *)expression);
  marray_detail::Geometry<std::allocator<unsigned_long>_>::resize
            ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),sVar5);
  sVar5 = BinaryViewExpression<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::Minus<float,_float,_float>_>
          ::dimension((BinaryViewExpression<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::Minus<float,_float,_float>_>
                       *)expression);
  if (sVar5 != 0) {
    uVar11 = 0;
    do {
      sVar5 = BinaryViewExpression<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::Minus<float,_float,_float>_>
              ::shape((BinaryViewExpression<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::Minus<float,_float,_float>_>
                       *)expression,uVar11);
      if (*(ulong *)(this + 0x28) <= uVar11) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"Assertion failed.");
        goto LAB_0014702e;
      }
      *(size_t *)(*(long *)(this + 0x10) + uVar11 * 8) = sVar5;
      uVar11 = uVar11 + 1;
      sVar5 = BinaryViewExpression<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::Minus<float,_float,_float>_>
              ::dimension((BinaryViewExpression<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::Minus<float,_float,_float>_>
                           *)expression);
    } while (uVar11 < sVar5);
  }
  this_00 = *(View<float,_true,_std::allocator<unsigned_long>_> **)expression;
  uVar11 = (this_00->geometry_).size_;
  uVar6 = *(ulong *)(*(long *)(expression + 8) + 0x30);
  if (*(ulong *)(*(long *)(expression + 8) + 0x30) < uVar11) {
    uVar6 = uVar11;
  }
  *(ulong *)(this + 0x30) = uVar6;
  this[0x3c] = (Marray<float,std::allocator<unsigned_long>>)0x1;
  View<float,_true,_std::allocator<unsigned_long>_>::testInvariant(this_00);
  CVar1 = (this_00->geometry_).coordinateOrder_;
  *(CoordinateOrder *)(this + 0x38) = CVar1;
  lVar7 = *(long *)(this + 0x28);
  if (lVar7 == 0) goto LAB_00146ffa;
  lVar2 = *(long *)(this + 0x10);
  puVar8 = *(undefined8 **)(this + 0x18);
  if (CVar1 == FirstMajorOrder) {
    puVar8[lVar7 + -1] = 1;
    if (lVar7 != 1) {
      lVar9 = 1;
      do {
        lVar9 = lVar9 * *(long *)(lVar2 + -8 + lVar7 * 8);
        puVar8[lVar7 + -2] = lVar9;
        lVar7 = lVar7 + -1;
      } while (lVar7 != 1);
      goto LAB_00146f92;
    }
    uVar11 = *(ulong *)(this + 0x28);
    if (uVar11 == 0) goto LAB_00147044;
    puVar8 = *(undefined8 **)(this + 0x20);
LAB_00146fd2:
    puVar8[uVar11 - 1] = 1;
    if (1 < uVar11) {
      lVar7 = 1;
      do {
        lVar7 = lVar7 * *(long *)(lVar2 + -8 + uVar11 * 8);
        puVar8[uVar11 - 2] = lVar7;
        uVar11 = uVar11 - 1;
      } while (uVar11 != 1);
    }
  }
  else {
    *puVar8 = 1;
    if (lVar7 == 1) {
      uVar11 = *(ulong *)(this + 0x28);
      if (uVar11 == 0) goto LAB_00147044;
      puVar8 = *(undefined8 **)(this + 0x20);
    }
    else {
      lVar9 = 1;
      lVar10 = 0;
      do {
        lVar9 = lVar9 * *(long *)(lVar2 + lVar10 * 8);
        puVar8[lVar10 + 1] = lVar9;
        lVar10 = lVar10 + 1;
      } while (lVar7 + -1 != lVar10);
LAB_00146f92:
      uVar11 = *(ulong *)(this + 0x28);
      if (uVar11 == 0) {
LAB_00147044:
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"Assertion failed.");
LAB_0014702e:
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      puVar8 = *(undefined8 **)(this + 0x20);
      if (CVar1 == FirstMajorOrder) goto LAB_00146fd2;
    }
    *puVar8 = 1;
    if (1 < uVar11) {
      lVar7 = 1;
      lVar9 = 0;
      do {
        lVar7 = lVar7 * *(long *)(lVar2 + lVar9 * 8);
        puVar8[lVar9 + 1] = lVar7;
        lVar9 = lVar9 + 1;
      } while (uVar11 - 1 != lVar9);
    }
  }
LAB_00146ffa:
  marray_detail::
  operate<andres::marray_detail::Assign<float,float>,float,std::allocator<unsigned_long>,andres::BinaryViewExpression<andres::View<float,true,std::allocator<unsigned_long>>,float,andres::View<float,true,std::allocator<unsigned_long>>,float,andres::marray_detail::Minus<float,float,float>>,float>
            (this,expression);
  return (Marray<float,_std::allocator<unsigned_long>_> *)this;
}

Assistant:

inline Marray<T, A>&
Marray<T, A>::operator=
(
    const ViewExpression<E, Te>& expression
)
{
    if(expression.overlaps(*this)) {
        Marray<T, A> m(expression); // temporary copy
        (*this) = m; // recursive call
    }
    else {
        // re-allocate memory (if necessary)
        if(this->size() != expression.size()) {
            dataAllocator_.deallocate(this->data_, this->size());
            this->data_ = dataAllocator_.allocate(expression.size());
        }
        
        // copy geometry
        this->geometry_.resize(expression.dimension());
        for(std::size_t j=0; j<expression.dimension(); ++j) {
            this->geometry_.shape(j) = expression.shape(j);
        }
        this->geometry_.size() = expression.size();
        this->geometry_.isSimple() = true;
        this->geometry_.coordinateOrder() = expression.coordinateOrder();
        if(this->geometry_.dimension() != 0) {
            marray_detail::stridesFromShape(this->geometry_.shapeBegin(), this->geometry_.shapeEnd(),
                this->geometry_.shapeStridesBegin(), this->geometry_.coordinateOrder());
            marray_detail::stridesFromShape(this->geometry_.shapeBegin(), this->geometry_.shapeEnd(),
                this->geometry_.stridesBegin(), this->geometry_.coordinateOrder());
        }
        
        // copy data
        marray_detail::operate(*this, expression, marray_detail::Assign<T, Te>());
    }
    return *this;
}